

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3SrcListDelete(sqlite3 *db,SrcList *pList)

{
  Expr *p;
  int iVar1;
  anon_union_8_2_996c0f8d_for_u1 *paVar2;
  
  if (pList != (SrcList *)0x0) {
    if (0 < pList->nSrc) {
      paVar2 = &pList->a[0].u1;
      iVar1 = 0;
      do {
        if (paVar2[-10].zIndexedBy != (char *)0x0) {
          sqlite3DbFreeNN(db,paVar2[-10].zIndexedBy);
        }
        if (paVar2[-9].zIndexedBy != (char *)0x0) {
          sqlite3DbFreeNN(db,paVar2[-9].zIndexedBy);
        }
        if (paVar2[-8].zIndexedBy != (char *)0x0) {
          sqlite3DbFreeNN(db,paVar2[-8].zIndexedBy);
        }
        if ((((ulong)paVar2->zIndexedBy & 0x20000000000) != 0) &&
           (paVar2->zIndexedBy != (char *)0x0)) {
          sqlite3DbFreeNN(db,paVar2->zIndexedBy);
        }
        if ((((ulong)paVar2->zIndexedBy & 0x40000000000) != 0) &&
           (paVar2->pFuncArg != (ExprList *)0x0)) {
          exprListDeleteNN(db,paVar2->pFuncArg);
        }
        sqlite3DeleteTable(db,(Table *)paVar2[-7].pFuncArg);
        if ((Select *)paVar2[-6].pFuncArg != (Select *)0x0) {
          clearSelect(db,(Select *)paVar2[-6].pFuncArg,1);
        }
        p = ((anon_union_8_2_eeb63324_for_u3 *)(paVar2 + -2))->pOn;
        if (((ulong)paVar2->zIndexedBy & 0x4000000000000) == 0) {
          if (p != (Expr *)0x0) {
            sqlite3ExprDeleteNN(db,p);
          }
        }
        else {
          sqlite3IdListDelete(db,(IdList *)p);
        }
        iVar1 = iVar1 + 1;
        paVar2 = paVar2 + 0xd;
      } while (iVar1 < pList->nSrc);
    }
    sqlite3DbFreeNN(db,pList);
    return;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SrcListDelete(sqlite3 *db, SrcList *pList){
  int i;
  SrcItem *pItem;
  if( pList==0 ) return;
  for(pItem=pList->a, i=0; i<pList->nSrc; i++, pItem++){
    if( pItem->zDatabase ) sqlite3DbFreeNN(db, pItem->zDatabase);
    sqlite3DbFree(db, pItem->zName);
    if( pItem->zAlias ) sqlite3DbFreeNN(db, pItem->zAlias);
    if( pItem->fg.isIndexedBy ) sqlite3DbFree(db, pItem->u1.zIndexedBy);
    if( pItem->fg.isTabFunc ) sqlite3ExprListDelete(db, pItem->u1.pFuncArg);
    sqlite3DeleteTable(db, pItem->pTab);
    if( pItem->pSelect ) sqlite3SelectDelete(db, pItem->pSelect);
    if( pItem->fg.isUsing ){
      sqlite3IdListDelete(db, pItem->u3.pUsing);
    }else if( pItem->u3.pOn ){
      sqlite3ExprDelete(db, pItem->u3.pOn);
    }
  }
  sqlite3DbFreeNN(db, pList);
}